

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O0

void __thiscall
btAxisSweep3Internal<unsigned_short>::btAxisSweep3Internal
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *worldAabbMin,
          btVector3 *worldAabbMax,unsigned_short handleMask,unsigned_short handleSentinel,
          unsigned_short userMaxHandles,btOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  undefined8 uVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  ulong uVar4;
  undefined2 in_CX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  btBroadphaseInterface *in_RDI;
  undefined2 in_R8W;
  short in_R9W;
  btVector3 bVar5;
  _func_int **in_stack_00000008;
  byte in_stack_00000010;
  int axis;
  int i_1;
  unsigned_short i;
  unsigned_short maxInt;
  btVector3 aabbSize;
  void *ptr;
  unsigned_short maxHandles;
  _func_int **in_stack_fffffffffffffec8;
  _func_int **in_stack_fffffffffffffed0;
  btVector3 *in_stack_fffffffffffffed8;
  _func_int **pp_Var6;
  btNullPairCache *in_stack_fffffffffffffee0;
  btHashedOverlappingPairCache *in_stack_fffffffffffffef0;
  undefined1 in_stack_ffffffffffffff28 [16];
  int local_84;
  int local_80;
  ushort local_7a;
  float local_78;
  float local_74;
  float local_70;
  btVector3 local_6c;
  undefined8 local_5c;
  undefined8 uStack_54;
  ushort local_4a;
  btScalar local_48;
  btScalar bStack_44;
  undefined8 local_40;
  _func_int **local_38;
  ushort local_2e;
  byte local_1f;
  short local_1e;
  undefined2 local_1c;
  undefined2 local_1a;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_1f = in_stack_00000010 & 1;
  local_1e = in_R9W;
  local_1c = in_R8W;
  local_1a = in_CX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  btBroadphaseInterface::btBroadphaseInterface(in_RDI);
  in_RDI->_vptr_btBroadphaseInterface = (_func_int **)&PTR__btAxisSweep3Internal_002e1980;
  *(undefined2 *)&in_RDI[1]._vptr_btBroadphaseInterface = local_1a;
  *(undefined2 *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 2) = local_1c;
  btVector3::btVector3((btVector3 *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 4));
  btVector3::btVector3((btVector3 *)((long)&in_RDI[3]._vptr_btBroadphaseInterface + 4));
  btVector3::btVector3((btVector3 *)((long)&in_RDI[5]._vptr_btBroadphaseInterface + 4));
  in_RDI[0x10]._vptr_btBroadphaseInterface = in_stack_00000008;
  in_RDI[0x11]._vptr_btBroadphaseInterface = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0x12]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)((long)&in_RDI[0x12]._vptr_btBroadphaseInterface + 4) = 0;
  in_RDI[0x13]._vptr_btBroadphaseInterface = (_func_int **)0x0;
  local_2e = local_1e + 1;
  if (in_RDI[0x10]._vptr_btBroadphaseInterface == (_func_int **)0x0) {
    pp_Var3 = (_func_int **)
              btAlignedAllocInternal
                        ((size_t)in_stack_fffffffffffffed0,
                         (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    local_38 = pp_Var3;
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(in_stack_fffffffffffffef0);
    in_RDI[0x10]._vptr_btBroadphaseInterface = pp_Var3;
    *(undefined1 *)&in_RDI[0x12]._vptr_btBroadphaseInterface = 1;
  }
  if ((local_1f & 1) == 0) {
    pp_Var3 = (_func_int **)
              btAlignedAllocInternal
                        ((size_t)in_stack_fffffffffffffed0,
                         (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    pp_Var3[2] = (_func_int *)0x0;
    pp_Var3[3] = (_func_int *)0x0;
    *pp_Var3 = (_func_int *)0x0;
    pp_Var3[1] = (_func_int *)0x0;
    pp_Var3[4] = (_func_int *)0x0;
    btNullPairCache::btNullPairCache(in_stack_fffffffffffffee0);
    in_RDI[0x14]._vptr_btBroadphaseInterface = pp_Var3;
    pp_Var3 = (_func_int **)
              btAlignedAllocInternal
                        ((size_t)in_stack_fffffffffffffed0,
                         (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    btDbvtBroadphase::btDbvtBroadphase
              (in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_);
    in_RDI[0x13]._vptr_btBroadphaseInterface = pp_Var3;
    *(undefined1 *)((long)in_RDI[0x13]._vptr_btBroadphaseInterface + 0x11d) = 1;
  }
  uVar1 = local_10[1];
  *(undefined8 *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 4) = *local_10;
  *(undefined8 *)((long)&in_RDI[2]._vptr_btBroadphaseInterface + 4) = uVar1;
  uVar1 = local_18[1];
  *(undefined8 *)((long)&in_RDI[3]._vptr_btBroadphaseInterface + 4) = *local_18;
  *(undefined8 *)((long)&in_RDI[4]._vptr_btBroadphaseInterface + 4) = uVar1;
  bVar5 = operator-((btVector3 *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_40 = bVar5.m_floats._8_8_;
  local_48 = bVar5.m_floats[0];
  bStack_44 = bVar5.m_floats[1];
  local_4a = *(ushort *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 2);
  local_70 = (float)local_4a;
  local_74 = (float)local_4a;
  local_78 = (float)local_4a;
  btVector3::btVector3(&local_6c,&local_70,&local_74,&local_78);
  bVar5 = operator/((btVector3 *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  uStack_54 = bVar5.m_floats._8_8_;
  local_5c = bVar5.m_floats._0_8_;
  *(undefined8 *)((long)&in_RDI[5]._vptr_btBroadphaseInterface + 4) = local_5c;
  *(undefined8 *)((long)&in_RDI[6]._vptr_btBroadphaseInterface + 4) = uStack_54;
  uVar4 = (ulong)local_2e;
  pp_Var3 = (_func_int **)Handle::operator_new__(0x1576c6);
  if (uVar4 != 0) {
    pp_Var6 = pp_Var3 + uVar4 * 10;
    pp_Var2 = pp_Var3;
    do {
      in_stack_fffffffffffffed0 = pp_Var2;
      Handle::Handle((Handle *)0x157705);
      pp_Var2 = in_stack_fffffffffffffed0 + 10;
    } while (in_stack_fffffffffffffed0 + 10 != pp_Var6);
  }
  in_RDI[8]._vptr_btBroadphaseInterface = pp_Var3;
  *(ushort *)((long)&in_RDI[7]._vptr_btBroadphaseInterface + 6) = local_2e;
  *(undefined2 *)((long)&in_RDI[7]._vptr_btBroadphaseInterface + 4) = 0;
  *(undefined2 *)&in_RDI[9]._vptr_btBroadphaseInterface = 1;
  for (local_7a = *(ushort *)&in_RDI[9]._vptr_btBroadphaseInterface; local_7a < local_2e;
      local_7a = local_7a + 1) {
    Handle::SetNextFree((Handle *)
                        ((long)in_RDI[8]._vptr_btBroadphaseInterface +
                        (ulong)((uint)local_7a * 0x50)),local_7a + 1);
  }
  Handle::SetNextFree((Handle *)
                      (((ulong)((uint)local_2e * 0x50) - 0x50) +
                      (long)in_RDI[8]._vptr_btBroadphaseInterface),0);
  for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
    in_stack_fffffffffffffec8 =
         (_func_int **)
         btAlignedAllocInternal
                   ((size_t)in_stack_fffffffffffffed0,
                    (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    in_RDI[(long)local_80 + 0xd]._vptr_btBroadphaseInterface = in_stack_fffffffffffffec8;
    in_RDI[(long)local_80 + 10]._vptr_btBroadphaseInterface =
         in_RDI[(long)local_80 + 0xd]._vptr_btBroadphaseInterface;
  }
  *in_RDI[8]._vptr_btBroadphaseInterface = (_func_int *)0x0;
  for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
    *(undefined2 *)((long)in_RDI[8]._vptr_btBroadphaseInterface + (long)local_84 * 2 + 0x3c) = 0;
    *(undefined2 *)((long)in_RDI[8]._vptr_btBroadphaseInterface + (long)local_84 * 2 + 0x42) = 1;
    *(undefined2 *)in_RDI[(long)local_84 + 10]._vptr_btBroadphaseInterface = 0;
    *(undefined2 *)((long)in_RDI[(long)local_84 + 10]._vptr_btBroadphaseInterface + 2) = 0;
    *(undefined2 *)((long)in_RDI[(long)local_84 + 10]._vptr_btBroadphaseInterface + 4) =
         *(undefined2 *)((long)&in_RDI[1]._vptr_btBroadphaseInterface + 2);
    *(undefined2 *)((long)in_RDI[(long)local_84 + 10]._vptr_btBroadphaseInterface + 6) = 0;
  }
  return;
}

Assistant:

btAxisSweep3Internal<BP_FP_INT_TYPE>::btAxisSweep3Internal(const btVector3& worldAabbMin,const btVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel,BP_FP_INT_TYPE userMaxHandles, btOverlappingPairCache* pairCache , bool disableRaycastAccelerator)
:m_bpHandleMask(handleMask),
m_handleSentinel(handleSentinel),
m_pairCache(pairCache),
m_userPairCallback(0),
m_ownsPairCache(false),
m_invalidPair(0),
m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles+1);//need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new(ptr) btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (btAlignedAlloc(sizeof(btNullPairCache),16)) btNullPairCache();
		m_raycastAccelerator = new (btAlignedAlloc(sizeof(btDbvtBroadphase),16)) btDbvtBroadphase(m_nullPairCache);//m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;//don't add/remove pairs
	}

	//btAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	btVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE	maxInt = m_handleSentinel;

	m_quantize = btVector3(btScalar(maxInt),btScalar(maxInt),btScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using btAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];
	
	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = btAlignedAlloc(sizeof(Edge)*maxHandles*2,16);
			m_pEdges[i] = new(m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels
	
	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

	}

}